

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O2

int vorbis_book_init_encode(codebook *c,static_codebook *s)

{
  ogg_uint32_t *poVar1;
  long lVar2;
  float fVar3;
  
  c->used_entries = 0;
  c->c = (static_codebook *)0x0;
  c->quantvals = 0;
  c->minval = 0;
  *(undefined8 *)&c->delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (float *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->dim = 0;
  c->entries = 0;
  c->c = s;
  lVar2 = s->entries;
  c->entries = lVar2;
  c->used_entries = lVar2;
  c->dim = s->dim;
  poVar1 = _make_words(s->lengthlist,lVar2,0);
  c->codelist = poVar1;
  lVar2 = _book_maptype1_quantvals(s);
  c->quantvals = (int)lVar2;
  fVar3 = _float32_unpack(s->q_min);
  fVar3 = rintf(fVar3);
  c->minval = (int)fVar3;
  fVar3 = _float32_unpack(s->q_delta);
  fVar3 = rintf(fVar3);
  c->delta = (int)fVar3;
  return 0;
}

Assistant:

int vorbis_book_init_encode(codebook *c,const static_codebook *s){

  memset(c,0,sizeof(*c));
  c->c=s;
  c->entries=s->entries;
  c->used_entries=s->entries;
  c->dim=s->dim;
  c->codelist=_make_words(s->lengthlist,s->entries,0);
  /* c->valuelist=_book_unquantize(s,s->entries,NULL); */
  c->quantvals=_book_maptype1_quantvals(s);
  c->minval=(int)rint(_float32_unpack(s->q_min));
  c->delta=(int)rint(_float32_unpack(s->q_delta));

  return(0);
}